

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::ShaderRenderCase::computeVertexReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int x;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  uint uVar33;
  uint uVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 c00;
  Vec4 c11;
  ShaderEvalContext evalCtx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_330;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  ShaderEvalContext local_240;
  
  local_318 = CONCAT44(local_318._4_4_,result->m_width);
  iVar11 = result->m_height;
  uVar1 = quadGrid->m_gridSize;
  uVar8 = uVar1 + 1;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_2f8 = CONCAT44(local_2f8._4_4_,*(undefined4 *)(CONCAT44(extraout_var,iVar4) + 0x14));
  ShaderEvalContext::ShaderEvalContext(&local_240,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_330,(long)(int)(uVar8 * uVar8),(allocator_type *)&local_2b8);
  if ((ulong)uVar1 < 0x7fffffff) {
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar12 = 0;
      local_308 = uVar6;
      do {
        ShaderEvalContext::reset
                  (&local_240,(float)(int)uVar12 / (float)(int)uVar1,
                   (float)(int)uVar6 / (float)(int)uVar1);
        (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_240);
        fVar25 = local_240.color.m_data[3];
        if ((int)(float)local_2f8 < 1) {
          fVar25 = 1.0;
        }
        iVar4 = (int)uVar12 + (int)lVar9;
        local_330.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2] = local_240.color.m_data[2];
        *(undefined8 *)
         local_330.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar4].m_data = local_240.color.m_data._0_8_;
        local_330.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[3] = fVar25;
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
      uVar6 = (ulong)((uint)local_308 + 1);
      lVar9 = lVar9 + (ulong)uVar8;
    } while ((uint)local_308 != uVar1);
  }
  if (0 < (int)uVar1) {
    local_2a8 = (float)(int)uVar1;
    local_288 = ZEXT416((uint)local_2a8);
    fVar25 = (float)(int)(float)local_318;
    local_298 = (float)iVar11;
    uVar6 = 0;
    fStack_2a4 = local_2a8;
    fStack_2a0 = local_2a8;
    fStack_29c = local_2a8;
    fStack_294 = local_298;
    fStack_290 = local_298;
    fStack_28c = local_298;
    do {
      iVar11 = (int)uVar6;
      uVar10 = iVar11 + 1;
      auVar34._0_4_ = (float)iVar11;
      auVar34._4_4_ = (float)(int)uVar10;
      auVar34._8_8_ = 0;
      auVar35._4_4_ = fStack_2a4;
      auVar35._0_4_ = local_2a8;
      auVar35._8_4_ = fStack_2a0;
      auVar35._12_4_ = fStack_29c;
      auVar35 = divps(auVar34,auVar35);
      local_278 = auVar35._0_4_ * local_298;
      fStack_274 = auVar35._4_4_ * fStack_294;
      fStack_270 = auVar35._8_4_ * fStack_290;
      fStack_26c = auVar35._12_4_ * fStack_28c;
      fVar16 = fStack_274 - local_278;
      fVar22 = fStack_274 + -0.5;
      fVar17 = ceilf(local_278 + -0.5);
      fVar22 = ceilf(fVar22);
      local_2d8 = (ulong)(iVar11 * uVar8);
      local_2e0 = (ulong)(uVar10 * uVar8);
      local_2d0 = 0;
      local_2e8 = (ulong)uVar10;
      do {
        iVar11 = (int)local_2d0;
        local_2d0 = local_2d0 + 1;
        fVar26 = ((float)iVar11 / (float)local_288._0_4_) * fVar25;
        fVar30 = ((float)(int)local_2d0 / (float)local_288._0_4_) * fVar25;
        fVar18 = ceilf(fVar26 + -0.5);
        fVar19 = ceilf(fVar30 + -0.5);
        local_2b8 = *(undefined8 *)
                     local_330.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_2d8 + iVar11].m_data;
        uStack_2b0 = *(undefined8 *)
                      (local_330.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2d8 + iVar11].m_data + 2
                      );
        uVar6 = *(ulong *)local_330.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)local_2d8 + iVar11 + 1].
                          m_data;
        uVar2 = *(undefined8 *)
                 (local_330.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)local_2d8 + iVar11 + 1].m_data + 2)
        ;
        local_2c8 = *(ulong *)local_330.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(int)local_2e0 + iVar11].
                              m_data;
        uStack_2c0 = *(undefined8 *)
                      (local_330.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2e0 + iVar11].m_data + 2
                      );
        local_258 = *(undefined8 *)
                     local_330.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_2e0 + iVar11 + 1].m_data;
        uStack_250 = *(undefined8 *)
                      (local_330.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_2e0 + iVar11 + 1].m_data
                      + 2);
        if ((int)fVar17 < (int)fVar22) {
          iVar11 = (int)fVar17;
          do {
            if ((int)fVar18 < (int)fVar19) {
              fVar31 = (((float)iVar11 + 0.5) - local_278) * (1.0 / fVar16);
              fVar32 = 1.0;
              if (fVar31 <= 1.0) {
                fVar32 = fVar31;
              }
              fVar32 = (float)(-(uint)(0.0 < fVar31) & (uint)fVar32);
              local_268 = fVar32;
              uStack_264 = 0;
              uStack_260 = 0;
              uStack_25c = 0;
              iVar4 = (int)fVar18;
              do {
                fVar37 = (((float)iVar4 + 0.5) - fVar26) * (1.0 / (fVar30 - fVar26));
                fVar31 = 1.0;
                if (fVar37 <= 1.0) {
                  fVar31 = fVar37;
                }
                fVar31 = (float)(-(uint)(0.0 < fVar37) & (uint)fVar31);
                puVar3 = &local_2b8;
                local_308 = local_2c8;
                uStack_300 = uStack_2c0;
                local_2f8 = uVar6;
                uStack_2f0 = uVar2;
                fVar37 = local_268;
                if (1.0 < local_268 + fVar31) {
                  fVar31 = 1.0 - fVar31;
                  local_308 = uVar6;
                  uStack_300 = uVar2;
                  local_2f8 = local_2c8;
                  uStack_2f0 = uStack_2c0;
                  puVar3 = &local_258;
                  fVar37 = 1.0 - fVar32;
                }
                local_318 = *puVar3;
                uStack_310 = puVar3[1];
                iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
                fVar20 = fVar31 * ((float)local_2f8 - (float)local_318) + (float)local_318;
                fVar23 = fVar31 * (local_2f8._4_4_ - local_318._4_4_) + local_318._4_4_;
                fVar24 = fVar31 * ((float)uStack_2f0 - (float)uStack_310) + (float)uStack_310;
                fVar27 = (float)local_308 - (float)local_318;
                fVar28 = local_308._4_4_ - local_318._4_4_;
                fVar29 = (float)uStack_300 - (float)uStack_310;
                fVar31 = fVar37 * (uStack_300._4_4_ - uStack_310._4_4_) +
                         fVar31 * (uStack_2f0._4_4_ - uStack_310._4_4_) + uStack_310._4_4_;
                if (*(int *)(CONCAT44(extraout_var_00,iVar5) + 0x14) == 1) {
                  fVar31 = floorf(fVar31 + 0.5);
                }
                fVar23 = (fVar37 * fVar28 + fVar23) * 255.0;
                fVar20 = (fVar37 * fVar27 + fVar20) * 255.0;
                fVar37 = (fVar37 * fVar29 + fVar24) * 255.0;
                uVar10 = -(uint)(fVar23 < 0.0);
                uVar13 = -(uint)(fVar20 < 0.0);
                uVar14 = -(uint)(fVar37 < 0.0);
                uVar15 = -(uint)(fVar31 * 255.0 < 0.0);
                uVar21 = (uint)((float)(uVar10 & 0xbf000000 | ~uVar10 & 0x3f000000) + fVar23);
                uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar20);
                uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar37);
                uVar15 = (uint)((float)(uVar15 & 0xbf000000 | ~uVar15 & 0x3f000000) + fVar31 * 255.0
                               );
                uVar10 = uVar13;
                if (0xfe < uVar13) {
                  uVar10 = 0xff;
                }
                uVar7 = uVar21;
                if (0xfe < uVar21) {
                  uVar7 = 0xff;
                }
                uVar33 = -(uint)(-0x7fffff02 < (int)(uVar14 ^ 0x80000000));
                uVar36 = -(uint)(-0x7fffff02 < (int)(uVar15 ^ 0x80000000));
                *(uint *)((long)(result->m_pixels).m_ptr +
                         (long)(result->m_width * iVar11 + iVar4) * 4) =
                     ~((int)uVar15 >> 0x1f) & (uVar36 >> 0x18 | ~uVar36 & uVar15) << 0x18 |
                     ~((int)uVar13 >> 0x1f) & uVar10 |
                     ~((int)uVar14 >> 0x1f) & (uVar33 >> 0x18 | ~uVar33 & uVar14) << 0x10 |
                     ~((int)uVar21 >> 0x1f) & uVar7 << 8;
                iVar4 = iVar4 + 1;
              } while ((int)fVar19 != iVar4);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 != (int)fVar22);
        }
      } while (local_2d0 != uVar1);
      uVar6 = local_2e8;
    } while ((uint)local_2e8 != uVar1);
  }
  if (local_330.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_330.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_330.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ShaderRenderCase::computeVertexReference(Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int				  width	= result.getWidth();
	int				  height   = result.getHeight();
	int				  gridSize = quadGrid.getGridSize();
	int				  stride   = gridSize + 1;
	bool			  hasAlpha = m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext evalCtx(quadGrid);

	// Evaluate color for each vertex.
	vector<Vec4> colors((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			evalCtx.reset(sx, sy);
			m_evaluator.evaluate(evalCtx);
			DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
			Vec4 color = evalCtx.color;

			if (!hasAlpha)
				color.w() = 1.0f;

			colors[vtxNdx] = color;
		}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			float x0 = static_cast<float>(x) / static_cast<float>(gridSize);
			float x1 = static_cast<float>(x + 1) / static_cast<float>(gridSize);
			float y0 = static_cast<float>(y) / static_cast<float>(gridSize);
			float y1 = static_cast<float>(y + 1) / static_cast<float>(gridSize);

			float sx0  = x0 * (float)width;
			float sx1  = x1 * (float)width;
			float sy0  = y0 * (float)height;
			float sy1  = y1 * (float)height;
			float oosx = 1.0f / (sx1 - sx0);
			float oosy = 1.0f / (sy1 - sy0);

			int ix0 = deCeilFloatToInt32(sx0 - 0.5f);
			int ix1 = deCeilFloatToInt32(sx1 - 0.5f);
			int iy0 = deCeilFloatToInt32(sy0 - 0.5f);
			int iy1 = deCeilFloatToInt32(sy1 - 0.5f);

			int  v00 = (y * stride) + x;
			int  v01 = (y * stride) + x + 1;
			int  v10 = ((y + 1) * stride) + x;
			int  v11 = ((y + 1) * stride) + x + 1;
			Vec4 c00 = colors[v00];
			Vec4 c01 = colors[v01];
			Vec4 c10 = colors[v10];
			Vec4 c11 = colors[v11];

			//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

			for (int iy = iy0; iy < iy1; iy++)
				for (int ix = ix0; ix < ix1; ix++)
				{
					DE_ASSERT(deInBounds32(ix, 0, width));
					DE_ASSERT(deInBounds32(iy, 0, height));

					float sfx = (float)ix + 0.5f;
					float sfy = (float)iy + 0.5f;
					float fx1 = deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
					float fy1 = deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

					// Triangle quad interpolation.
					bool		tri   = fx1 + fy1 <= 1.0f;
					float		tx	= tri ? fx1 : (1.0f - fx1);
					float		ty	= tri ? fy1 : (1.0f - fy1);
					const Vec4& t0	= tri ? c00 : c11;
					const Vec4& t1	= tri ? c01 : c10;
					const Vec4& t2	= tri ? c10 : c01;
					Vec4		color = t0 + (t1 - t0) * tx + (t2 - t0) * ty;

					// Quantizing for 1-bit alpha
					if ((m_renderCtx.getRenderTarget().getPixelFormat().alphaBits) == 1)
						color.w() = deFloatRound(color.w());

					result.setPixel(ix, iy, toRGBA(color));
				}
		}
}